

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::SubroutineFunctionSet
          (SubroutineFunctionSet *this,UniformValueGenerator *generator,size_t count)

{
  pointer this_00;
  Index _index;
  SubroutineFunction local_130;
  
  _index.super_LayoutSpecifierBase.occurence.occurence = NONE_SH;
  _index.super_LayoutSpecifierBase.val = 1999999;
  _index.super_LayoutSpecifierBase.numSys = Dec;
  SubroutineFunction::SubroutineFunction(&local_130,generator,_index);
  if (0x7c1f07c1f07c1f < count) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = std::
            _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ::_M_allocate((_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                           *)count,(size_t)generator);
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_start = this_00;
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = this_00;
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = this_00 + count;
  if (count != 0) {
    do {
      SubroutineFunction::SubroutineFunction(this_00,&local_130);
      this_00 = this_00 + 1;
      count = count - 1;
    } while (count != 0);
  }
  (this->fn).
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.name._M_dataplus._M_p != &local_130.name.field_2) {
    operator_delete(local_130.name._M_dataplus._M_p,local_130.name.field_2._M_allocated_capacity + 1
                   );
  }
  UniformValue::~UniformValue(&local_130.embeddedRetVal);
  (this->typeName)._M_dataplus._M_p = (pointer)&(this->typeName).field_2;
  (this->typeName)._M_string_length = 0;
  (this->typeName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SubroutineFunctionSet(UniformValueGenerator& generator, size_t count = 0) : fn(count, SubroutineFunction(generator))
	{
	}